

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O1

int main(int argc,char **argv)

{
  char *pcVar1;
  char *pcVar2;
  
  pcVar1 = realpath("/proc/self/exe",(char *)0x0);
  pcVar2 = strrchr(pcVar1,0x2f);
  pcVar2 = strndup(pcVar1,(long)pcVar2 - (long)pcVar1);
  apprun_env_set("ORIGIN",pcVar2,(char *)0x0,pcVar2);
  pcVar2 = find_module_env_file(pcVar1);
  if (pcVar2 == (char *)0x0) {
    pcVar2 = find_legacy_env_file(pcVar1);
    pcVar1 = resole_appdir_path(pcVar2);
    apprun_env_set("APPDIR",pcVar1,(char *)0x0,pcVar1);
  }
  apprun_load_env_file(pcVar2,argv);
  setup_runtime();
  launch();
  return 1;
}

Assistant:

int main(int argc, char *argv[]) {
    char *apprun_path = resolve_apprun_path();
    char *origin_path = resolve_origin(apprun_path);
    apprun_env_set("ORIGIN", origin_path, NULL, origin_path);

    char *module_env_file_path = find_module_env_file(apprun_path);
    if (module_env_file_path != NULL)
        apprun_load_env_file(module_env_file_path, argv);

    if (module_env_file_path == NULL) {
        char *legacy_env_file_path = find_legacy_env_file(apprun_path);
        char *appdir_path = resole_appdir_path(legacy_env_file_path);

        apprun_env_set("APPDIR", appdir_path, NULL, appdir_path);
        apprun_load_env_file(legacy_env_file_path, argv);
    }

    setup_runtime();
    launch();

    return 1;
}